

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

bool __thiscall
ProjectBuilderMakefileGenerator::writeMakefile(ProjectBuilderMakefileGenerator *this,QTextStream *t)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  QTextStream *in_stack_00000118;
  ProjectBuilderMakefileGenerator *in_stack_00000120;
  QTextStream *in_stack_00001620;
  ProjectBuilderMakefileGenerator *in_stack_00001628;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  QMakeProject *in_stack_fffffffffffffd40;
  ProKey *in_stack_fffffffffffffd50;
  QMakeEvaluator *this_00;
  ProString *this_01;
  bool local_281;
  bool local_249;
  undefined1 local_98 [48];
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)((long)in_RDI + 0xe1) = 0;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                 (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  QMakeProject::values
            (in_stack_fffffffffffffd40,
             (ProKey *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x112951);
  ProKey::~ProKey((ProKey *)0x112964);
  __stream = _stderr;
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (QMakeEvaluator *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                   (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    QMakeProject::values
              (in_stack_fffffffffffffd40,
               (ProKey *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    QList<ProString>::clear((QList<ProString> *)in_stack_fffffffffffffd40);
    ProKey::~ProKey((ProKey *)0x112a67);
    this_01 = (ProString *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                   (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    QMakeProject::values
              (in_stack_fffffffffffffd40,
               (ProKey *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    ProString::ProString((ProString *)in_stack_fffffffffffffd40,(char *)this_00);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_fffffffffffffd40,
               (rvalue_ref)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    ProString::~ProString((ProString *)0x112ad6);
    ProKey::~ProKey((ProKey *)0x112ae3);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                   (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    QMakeEvaluator::first(this_00,in_stack_fffffffffffffd50);
    bVar1 = ProString::operator==(this_01,(char *)this_00);
    local_281 = true;
    if (!bVar1) {
      in_stack_fffffffffffffd50 = (ProKey *)in_RDI[0x1b];
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                     (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      QMakeEvaluator::first(this_00,in_stack_fffffffffffffd50);
      local_281 = ProString::operator==(this_01,(char *)this_00);
      ProString::~ProString((ProString *)0x112bcc);
      ProKey::~ProKey((ProKey *)0x112be2);
    }
    ProString::~ProString((ProString *)0x112bef);
    ProKey::~ProKey((ProKey *)0x112bfc);
    if (local_281 == false) {
      ProKey::ProKey((ProKey *)in_RDI[0x1b],
                     (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
      QMakeEvaluator::first(this_00,in_stack_fffffffffffffd50);
      bVar1 = ProString::operator==(this_01,(char *)this_00);
      ProString::~ProString((ProString *)0x112c84);
      ProKey::~ProKey((ProKey *)0x112c91);
      if (bVar1) {
        local_249 = writeSubDirs(in_stack_00000120,in_stack_00000118);
      }
      else {
        local_249 = false;
      }
    }
    else {
      local_249 = writeMakeParts(in_stack_00001628,in_stack_00001620);
    }
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                   (char *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    (**(code **)(*in_RDI + 0xb0))(local_68,in_RDI,local_98);
    QString::toLatin1((QString *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
    pcVar2 = QByteArray::constData((QByteArray *)0x1129d4);
    fprintf(__stream,"Project file not generated because all requirements not met:\n\t%s\n",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x1129f7);
    QString::~QString((QString *)0x112a04);
    ProKey::~ProKey((ProKey *)0x112a11);
    local_249 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_249;
  }
  __stack_chk_fail();
}

Assistant:

bool
ProjectBuilderMakefileGenerator::writeMakefile(QTextStream &t)
{
    writingUnixMakefileGenerator = false;
    if(!project->values("QMAKE_FAILED_REQUIREMENTS").isEmpty()) {
        /* for now just dump, I need to generated an empty xml or something.. */
        fprintf(stderr, "Project file not generated because all requirements not met:\n\t%s\n",
                var("QMAKE_FAILED_REQUIREMENTS").toLatin1().constData());
        return true;
    }

    project->values("MAKEFILE").clear();
    project->values("MAKEFILE").append("Makefile");
    if(project->first("TEMPLATE") == "app" || project->first("TEMPLATE") == "lib")
        return writeMakeParts(t);
    else if(project->first("TEMPLATE") == "subdirs")
        return writeSubDirs(t);
    return false;
}